

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O1

void __thiscall
customUnits_uniquenesspermeter3_Test::TestBody(customUnits_uniquenesspermeter3_Test *this)

{
  int iVar1;
  bool bVar2;
  unit_data uVar3;
  uint extraout_EAX;
  uint uVar4;
  uint extraout_EAX_00;
  undefined4 extraout_EAX_01;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  char *message;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  double in_XMM1_Qa;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__2;
  precise_unit cunit2adj;
  precise_unit cunit1adj;
  precise_unit cunit1;
  unsigned_short local_ba;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  AssertHelper local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  precise_unit local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  precise_unit local_58;
  AssertHelper local_48;
  precise_unit local_40;
  
  local_ba = 0;
  do {
    uVar3 = units::precise::custom::custom_unit(local_ba);
    local_40._8_8_ = ZEXT48((uint)uVar3);
    local_40.multiplier_ = 1.0;
    local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)units::detail::power_const<double>(1.0,3);
    units::detail::unit_data::pow
              ((unit_data *)(units::precise::meter + 8),(double)local_60,in_XMM1_Qa);
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)extraout_EAX;
    local_a0 = (undefined1  [8])local_60;
    local_58 = units::precise_unit::operator/(&local_40,(precise_unit *)local_a0);
    uVar3 = local_58.base_units_;
    uVar5 = ((int)uVar3 << 0x1c) >> 0x1c;
    uVar10 = -uVar5;
    if (0 < (int)uVar5) {
      uVar10 = uVar5;
    }
    uVar6 = (int)local_58.base_units_._0_1_ >> 4;
    uVar5 = -uVar6;
    if (0 < (int)uVar6) {
      uVar5 = uVar6;
    }
    uVar7 = ((int)uVar3 << 0x15) >> 0x1d;
    uVar6 = -uVar7;
    if (0 < (int)uVar7) {
      uVar6 = uVar7;
    }
    iVar8 = ((int)uVar3 << 0xd) >> 0x1d;
    iVar1 = -iVar8;
    if (0 < iVar8) {
      iVar1 = iVar8;
    }
    uVar11 = (int)local_58.base_units_._0_2_ >> 0xe;
    uVar7 = -uVar11;
    if (0 < (int)uVar11) {
      uVar7 = uVar11;
    }
    uVar4 = ((int)uVar3 << 6) >> 0x1e;
    uVar11 = -uVar4;
    if (0 < (int)uVar4) {
      uVar11 = uVar4;
    }
    local_b0._0_4_ =
         (uint)(uVar7 < 2) * 0x20 + (uint)(iVar1 == 3) * 0x10 +
         ((uint)(((uint)uVar3 & 0x3800) == 0x2000) << 6 |
          (uint)uVar3 >> 0x1a & 4 | (uint)uVar3 >> 0x1c & 2 | (uint)uVar3 >> 0x1e & 1 |
          (uint)(uVar10 < 4) << 8 | (uint)(5 < uVar5) << 9 | (uint)(uVar6 < 2) << 7) +
         (uint)(1 < uVar11) * 8;
    testing::internal::CmpHelperEQ<int,unsigned_short>
              ((internal *)local_a0,"precise::custom::custom_unit_number(cunit1adj.base_units())",
               "ii",(int *)local_b0,&local_ba);
    if (local_a0[0] == '\0') {
      testing::Message::Message((Message *)local_b0);
      pcVar9 = "";
      if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = (local_98->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,1000,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
      if (local_b0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b0 + 8))();
      }
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    uVar3 = units::detail::unit_data::inv(&local_58.base_units_);
    uVar5 = ((int)uVar3 << 0x1c) >> 0x1c;
    uVar10 = -uVar5;
    if (0 < (int)uVar5) {
      uVar10 = uVar5;
    }
    uVar6 = (int)uVar3._0_1_ >> 4;
    uVar5 = -uVar6;
    if (0 < (int)uVar6) {
      uVar5 = uVar6;
    }
    uVar7 = ((int)uVar3 << 0x15) >> 0x1d;
    uVar6 = -uVar7;
    if (0 < (int)uVar7) {
      uVar6 = uVar7;
    }
    iVar8 = ((int)uVar3 << 0xd) >> 0x1d;
    iVar1 = -iVar8;
    if (0 < iVar8) {
      iVar1 = iVar8;
    }
    uVar11 = (int)uVar3._0_2_ >> 0xe;
    uVar7 = -uVar11;
    if (0 < (int)uVar11) {
      uVar7 = uVar11;
    }
    uVar4 = ((int)uVar3 << 6) >> 0x1e;
    uVar11 = -uVar4;
    if (0 < (int)uVar4) {
      uVar11 = uVar4;
    }
    uVar10 = (uint)(((uint)uVar3 & 0x3800) == 0x2000) << 6 |
             (uint)uVar3 >> 0x1a & 4 | (uint)uVar3 >> 0x1c & 2 | (uint)uVar3 >> 0x1e & 1 |
             (uint)(uVar10 < 4) << 8 | (uint)(5 < uVar5) << 9 | (uint)(uVar6 < 2) << 7;
    pcVar9 = (char *)(ulong)uVar10;
    local_b0._0_4_ =
         (uint)(uVar7 < 2) * 0x20 + (uint)(iVar1 == 3) * 0x10 + uVar10 + (uint)(1 < uVar11) * 8;
    testing::internal::CmpHelperEQ<int,unsigned_short>
              ((internal *)local_a0,
               "precise::custom::custom_unit_number(cunit1adj.inv().base_units())","ii",
               (int *)local_b0,&local_ba);
    if (local_a0[0] == '\0') {
      testing::Message::Message((Message *)local_b0);
      message = "";
      if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = (local_98->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x3eb,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
      if (local_b0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b0 + 8))();
      }
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    if (((uint)local_40.base_units_ & 0x180000) == 0x100000) {
      uVar5 = ((int)local_40.base_units_ << 0x12) >> 0x1d;
      uVar10 = -uVar5;
      if (0 < (int)uVar5) {
        uVar10 = uVar5;
      }
      local_b0[0] = uVar10 >= 2;
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (uVar10 < 2) goto LAB_001448bb;
    }
    else {
      local_b0 = (undefined1  [8])((ulong)(uint7)local_b0._1_7_ << 8);
LAB_001448bb:
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_70);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)local_70.multiplier_ + 0x10),
                 "Error with custom unit/meter3 detection ",0x28);
      std::ostream::_M_insert<unsigned_long>((long)local_70.multiplier_ + 0x10);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)local_b0,
                 (AssertionResult *)"precise::custom::is_custom_unit(cunit1.base_units())","false",
                 "true",pcVar9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x3ec,(char *)local_a0);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_a0 != (undefined1  [8])&local_90) {
        operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
      }
      if ((long *)local_70.multiplier_ != (long *)0x0) {
        (**(code **)(*(long *)local_70.multiplier_ + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    if (((uint)local_58.base_units_ & 0x180000) == 0x100000) {
      uVar5 = ((int)local_58.base_units_ << 0x12) >> 0x1d;
      uVar10 = -uVar5;
      if (0 < (int)uVar5) {
        uVar10 = uVar5;
      }
      local_b0[0] = uVar10 >= 2;
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (uVar10 < 2) goto LAB_001449c8;
    }
    else {
      local_b0 = (undefined1  [8])((ulong)(uint7)local_b0._1_7_ << 8);
LAB_001449c8:
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_70);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)local_70.multiplier_ + 0x10),
                 "Error with custom unit/meter3 detection of inverse ",0x33);
      std::ostream::_M_insert<unsigned_long>((long)local_70.multiplier_ + 0x10);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)local_b0,
                 (AssertionResult *)"precise::custom::is_custom_unit(cunit1adj.base_units())",
                 "false","true",pcVar9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x3ee,(char *)local_a0);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_a0 != (undefined1  [8])&local_90) {
        operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
      }
      if ((long *)local_70.multiplier_ != (long *)0x0) {
        (**(code **)(*(long *)local_70.multiplier_ + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    uVar12 = 0;
    do {
      if (uVar12 != local_ba) {
        uVar3 = units::precise::custom::custom_unit((uint16_t)uVar12);
        local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (ulong)(uint)uVar3;
        local_b0 = (undefined1  [8])0x3ff0000000000000;
        local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)units::detail::power_const<double>(1.0,3);
        units::detail::unit_data::pow
                  ((unit_data *)(units::precise::m + 8),(double)local_60,in_XMM1_Qa);
        local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (ulong)extraout_EAX_00;
        local_a0 = (undefined1  [8])local_60;
        local_70 = units::precise_unit::operator/((precise_unit *)local_b0,(precise_unit *)local_a0)
        ;
        bVar2 = units::precise_unit::operator==(&local_40,&local_70);
        local_80.data_._0_1_ = (internal)!bVar2;
        local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_80.data_._0_1_) {
          testing::Message::Message((Message *)&local_b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_b8._M_head_impl + 0x10),
                     "Error with false per meter3 comparison 1 inv index ",0x33);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_b8._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_b8._M_head_impl + 0x10),",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_b8._M_head_impl + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a0,(internal *)&local_80,
                     (AssertionResult *)"cunit1 == cunit2adj","true","false",pcVar9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x3f6,(char *)local_a0);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_a0 != (undefined1  [8])&local_90) {
            operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
          }
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
        bVar2 = units::precise_unit::operator==(&local_58,(precise_unit *)local_b0);
        local_80.data_._0_1_ = (internal)!bVar2;
        local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_80.data_._0_1_) {
          testing::Message::Message((Message *)&local_b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_b8._M_head_impl + 0x10),
                     "Error with false per meter3 comparison 2 index ",0x2f);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_b8._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_b8._M_head_impl + 0x10),",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_b8._M_head_impl + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a0,(internal *)&local_80,
                     (AssertionResult *)"cunit1adj == cunit2","true","false",pcVar9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x3f9,(char *)local_a0);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_a0 != (undefined1  [8])&local_90) {
            operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
          }
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
        bVar2 = units::precise_unit::operator==(&local_58,&local_70);
        local_80.data_._0_1_ = (internal)!bVar2;
        local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_80.data_._0_1_) {
          testing::Message::Message((Message *)&local_b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_b8._M_head_impl + 0x10),
                     "Error with false per meter3 comparison 2 per meter3 index ",0x3a);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_b8._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_b8._M_head_impl + 0x10),",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_b8._M_head_impl + 0x10));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a0,(internal *)&local_80,
                     (AssertionResult *)"cunit1adj == cunit2adj","true","false",pcVar9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x3fc,(char *)local_a0);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_a0 != (undefined1  [8])&local_90) {
            operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
          }
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0x400);
    local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)units::detail::power_const<double>(1.0,3);
    units::detail::unit_data::pow((unit_data *)(units::precise::m + 8),(double)local_60,in_XMM1_Qa);
    local_70.base_units_ = (unit_data)extraout_EAX_01;
    local_70.multiplier_ = (double)local_60;
    local_70.commodity_ = 0;
    local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((double)local_60 * local_58.multiplier_);
    uVar3 = units::detail::unit_data::operator*(&local_58.base_units_,&local_70.base_units_);
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(local_70.commodity_ | local_58.commodity_,uVar3);
    local_a0 = (undefined1  [8])local_60;
    bVar2 = units::precise_unit::operator==((precise_unit *)local_a0,&local_40);
    local_b0[0] = bVar2;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_70);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)local_70.multiplier_ + 0x10),
                 "Error with true per meter3 multiply",0x23);
      std::ostream::_M_insert<unsigned_long>((long)local_70.multiplier_ + 0x10);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)local_b0,
                 (AssertionResult *)"cunit1adj * precise::m.pow(3) == cunit1","false","true",pcVar9)
      ;
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x400,(char *)local_a0);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_a0 != (undefined1  [8])&local_90) {
        operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
      }
      if ((long *)local_70.multiplier_ != (long *)0x0) {
        (**(code **)(*(long *)local_70.multiplier_ + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    local_ba = local_ba + 1;
    if (0x3ff < local_ba) {
      return;
    }
  } while( true );
}

Assistant:

TEST(customUnits, uniquenesspermeter3)
{
    for (std::uint16_t ii = 0; ii < 1024; ++ii) {
        auto cunit1 = precise::generate_custom_unit(ii);
        auto cunit1adj = cunit1 / precise::meter.pow(3);
        EXPECT_EQ(
            precise::custom::custom_unit_number(cunit1adj.base_units()), ii);
        EXPECT_EQ(
            precise::custom::custom_unit_number(cunit1adj.inv().base_units()),
            ii);
        EXPECT_TRUE(precise::custom::is_custom_unit(cunit1.base_units()))
            << "Error with custom unit/meter3 detection " << ii;
        EXPECT_TRUE(precise::custom::is_custom_unit(cunit1adj.base_units()))
            << "Error with custom unit/meter3 detection of inverse " << ii;
        for (std::uint16_t jj = 0; jj < 1024; ++jj) {
            if (ii == jj) {
                continue;
            }
            auto cunit2 = precise::generate_custom_unit(jj);
            auto cunit2adj = cunit2 / precise::m.pow(3);
            EXPECT_FALSE(cunit1 == cunit2adj)
                << "Error with false per meter3 comparison 1 inv index " << ii
                << "," << jj;
            EXPECT_FALSE(cunit1adj == cunit2)
                << "Error with false per meter3 comparison 2 index " << ii
                << "," << jj;
            EXPECT_FALSE(cunit1adj == cunit2adj)
                << "Error with false per meter3 comparison 2 per meter3 index "
                << ii << "," << jj;
        }
        EXPECT_TRUE(cunit1adj * precise::m.pow(3) == cunit1)
            << "Error with true per meter3 multiply" << ii;
    }
}